

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

bool tinyusdz::inverse(matrix4d *_m,matrix4d *inv_m,double eps)

{
  long lVar1;
  mat<double,_4,_4> *a;
  double *pdVar2;
  mat<double,_4,_4> *pmVar3;
  byte bVar4;
  double dVar5;
  double dVar6;
  matrix4d outm;
  mat<double,_4,_4> local_110;
  mat<double,_4,_4> local_90;
  
  bVar4 = 0;
  pdVar2 = (double *)_m;
  pmVar3 = &local_110;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pmVar3->x).x = *pdVar2;
    pdVar2 = pdVar2 + 1;
    pmVar3 = (mat<double,_4,_4> *)&(pmVar3->x).y;
  }
  dVar5 = linalg::determinant<double>(&local_110);
  dVar5 = ABS(dVar5);
  if (eps < dVar5) {
    dVar6 = dVar5;
    if (dVar5 <= 0.0) {
      dVar6 = 0.0;
    }
    if (dVar6 * eps < dVar5) {
      pmVar3 = &local_110;
      for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
        (pmVar3->x).x = _m->m[0][0];
        _m = (matrix4d *)((long)_m + ((ulong)bVar4 * -2 + 1) * 8);
        pmVar3 = (mat<double,_4,_4> *)((long)pmVar3 + (ulong)bVar4 * -0x10 + 8);
      }
      linalg::inverse<double,4>(&local_90,(linalg *)&local_110,a);
      pmVar3 = &local_90;
      for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
        inv_m->m[0][0] = (pmVar3->x).x;
        pmVar3 = (mat<double,_4,_4> *)((long)pmVar3 + (ulong)bVar4 * -0x10 + 8);
        inv_m = (matrix4d *)((long)inv_m + ((ulong)bVar4 * -2 + 1) * 8);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool inverse(const value::matrix4d &_m, value::matrix4d &inv_m, double eps) {
  double det = determinant(_m);

  if (math::is_close(std::fabs(det), 0.0, eps)) {
    return false;
  }

  inv_m = inverse(_m);
  return true;
}